

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  undefined1 local_3d8 [8];
  Node ast;
  Parser parser;
  char **argv_local;
  int argc_local;
  
  this = &ast.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  Parser::Parser((Parser *)this);
  Parser::parse((Node *)local_3d8,(Parser *)this);
  lab2_3((Parser *)
         &ast.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage);
  Node::~Node((Node *)local_3d8);
  Parser::~Parser((Parser *)
                  &ast.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    Parser parser = Parser();
    Node ast = parser.parse();
    lab2_3(parser); // done
//    lab4(parser); // done
//    lab5(); // done
//    lab6(ast); // done
//    lab7(parser, ast); // done
    return 0;

}